

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.cpp
# Opt level: O2

void TestSignalCopy(void)

{
  __sighandler_t __handler;
  bool receiverCalled;
  signal<void_(int,_bool)> sg2;
  signal<void_(int,_bool)> sg;
  signal<void_(int,_bool)> sg3;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  connection local_20;
  
  TestRunner::StartTest("TestSignalCopy");
  std::make_shared<lsignal::signal<void(int,bool)>::internal_data>();
  local_40._M_unused._M_object = &receiverCalled;
  receiverCalled = false;
  local_40._8_8_ = 0x100000007;
  local_28 = std::
             _Function_handler<void_(int,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/balmerdx[P]lsignal/tests/test_basic.cpp:352:44)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(int,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/balmerdx[P]lsignal/tests/test_basic.cpp:352:44)>
             ::_M_manager;
  lsignal::signal<void_(int,_bool)>::connect
            ((signal<void_(int,_bool)> *)&local_20,(int)&sg,(sockaddr *)&local_40,0);
  lsignal::connection::~connection(&local_20);
  std::make_shared<lsignal::signal<void(int,bool)>::internal_data>();
  lsignal::signal<void_(int,_bool)>::operator=(&sg2,&sg);
  lsignal::signal<void_(int,_bool)>::operator()(&sg2,7,true);
  AssertHelper::VerifyValue(true,receiverCalled,"Receiver2 should be called.");
  receiverCalled = false;
  lsignal::signal<void_(int,_bool)>::signal(&sg3,(int)&sg,__handler);
  lsignal::signal<void_(int,_bool)>::operator()(&sg3,7,true);
  AssertHelper::VerifyValue(true,receiverCalled,"Receiver3 should be called.");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sg3._data.
              super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sg2._data.
              super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sg._data.
              super___shared_ptr<lsignal::signal<void_(int,_bool)>::internal_data,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void TestSignalCopy()
{
	TestRunner::StartTest(MethodName);

	lsignal::signal<void(int, bool)> sg;

	int paramOne = 7;
	bool paramTwo = true;

	bool receiverCalled = false;

	std::function<void(int, bool)> receiver = [=, &receiverCalled](int p0, bool p1)
	{
		receiverCalled = true;

		AssertHelper::VerifyValue(paramOne, p0, "First parameter should be as expected.");
		AssertHelper::VerifyValue(paramTwo, p1, "Second parameter should be as expected.");
	};

	sg.connect(receiver, nullptr);

	lsignal::signal<void(int, bool)> sg2;
	sg2 = sg;
	sg2(paramOne, paramTwo);

	AssertHelper::VerifyValue(true, receiverCalled, "Receiver2 should be called.");

	receiverCalled = false;
	lsignal::signal<void(int, bool)> sg3 = sg;
	sg3(paramOne, paramTwo);

	AssertHelper::VerifyValue(true, receiverCalled, "Receiver3 should be called.");
}